

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O0

void __thiscall QSynth::setOutputGain(QSynth *this,float outputGain)

{
  bool bVar1;
  undefined1 local_28 [8];
  QMutexLocker<QMutex> synthLocker;
  float outputGain_local;
  QSynth *this_local;
  
  synthLocker._12_4_ = outputGain;
  bVar1 = isRealtime(this);
  if (bVar1) {
    RealtimeHelper::setOutputGain(this->realtimeHelper,(float)synthLocker._12_4_);
  }
  else {
    QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)local_28,this->synthMutex);
    bVar1 = isOpen(this);
    if (bVar1) {
      MT32Emu::Synth::setOutputGain(this->synth,(float)synthLocker._12_4_);
    }
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
  }
  return;
}

Assistant:

void QSynth::setOutputGain(float outputGain) {
	if (isRealtime()) {
		realtimeHelper->setOutputGain(outputGain);
	} else {
		QMutexLocker synthLocker(synthMutex);
		if (isOpen()) synth->setOutputGain(outputGain);
	}
}